

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basist::basisu_transcoder_state::block_preds>::vector
          (vector<basist::basisu_transcoder_state::block_preds> *this,
          vector<basist::basisu_transcoder_state::block_preds> *other)

{
  vector<basist::basisu_transcoder_state::block_preds> *in_RSI;
  long *in_RDI;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  increase_capacity(in_RSI,(uint32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                    SUB81((ulong)in_RDI >> 0x10,0));
  *(uint32_t *)(in_RDI + 1) = in_RSI->m_size;
  if ((*in_RDI != 0) && (in_RSI->m_p != (block_preds *)0x0)) {
    memcpy((void *)*in_RDI,in_RSI->m_p,(ulong)*(uint *)(in_RDI + 1) << 2);
  }
  return;
}

Assistant:

inline vector(const vector& other) :
         m_p(NULL),
         m_size(0),
         m_capacity(0)
      {
         increase_capacity(other.m_size, false);

         m_size = other.m_size;

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }
      }